

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void process_constructor(gvisitor_t *self,gravity_class_t *c,gnode_t *node)

{
  gravity_vm *vm;
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  gravity_function_t *f;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 f_00;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  ircode_t *piVar5;
  ircode_t *piVar6;
  gravity_class_t *pgVar7;
  int iVar8;
  gravity_value_t value;
  gravity_value_t gVar9;
  char name [256];
  char local_138 [264];
  
  f = class_lookup_nosuper(c,"$init");
  f_00.p = (gravity_object_t *)class_lookup_nosuper(c,"init");
  pgVar7 = c->superclass;
  if (pgVar7 != (gravity_class_t *)0x0) {
    do {
      aVar4.p = (gravity_object_t *)class_lookup_nosuper(pgVar7,"$init");
      if ((gravity_function_t *)aVar4.n != (gravity_function_t *)0x0) {
        if (f == (gravity_function_t *)0x0) {
          piVar5 = ircode_create(1);
          f = gravity_function_new((gravity_vm *)0x0,"$init",1,0,0,piVar5);
        }
        snprintf(local_138,0x100,"%s%d","$init");
        gVar9.field_1.p = (gravity_object_t *)aVar4.n;
        gVar9.isa = (aVar4.p)->isa;
        gravity_class_bind(c,local_138,gVar9);
        gVar9 = gravity_string_to_value
                          (*(gravity_vm **)((long)self->data + 0x38),local_138,0xffffffff);
        uVar1 = gravity_function_cpool_add((gravity_vm *)0x0,f,gVar9);
        ircode_patch_init((ircode_t *)(f->field_9).field_0.bytecode,uVar1);
      }
      pgVar7 = pgVar7->superclass;
    } while (pgVar7 != (gravity_class_s *)0x0);
  }
  if (f != (gravity_function_t *)0x0 || (gravity_function_t *)f_00.n != (gravity_function_t *)0x0) {
    if (f != (gravity_function_t *)0x0) {
      piVar5 = (ircode_t *)(f->field_9).field_0.bytecode;
      if (piVar5 == (ircode_t *)0x0) {
        report_error(self,node,"Invalid code context.");
      }
      else {
        if (node == (gnode_t *)0x0) {
          uVar2 = 0;
        }
        else {
          uVar2 = (node->token).lineno;
        }
        ircode_add(piVar5,RET0,0,0,0,uVar2);
        if ((gravity_function_t *)f_00.n == (gravity_function_t *)0x0) {
          piVar6 = ircode_create(1);
          uVar2 = 0;
          f_00.p = (gravity_object_t *)gravity_function_new((gravity_vm *)0x0,"init",1,0,2,piVar6);
          piVar6 = *(ircode_t **)(f_00.n + 0xa0);
          if (node == (gnode_t *)0x0) {
            ircode_add_skip(piVar6,0);
          }
          else {
            ircode_add_skip(piVar6,(node->token).lineno);
            uVar2 = (node->token).lineno;
          }
          ircode_add_skip(piVar6,uVar2);
          if (node == (gnode_t *)0x0) {
            uVar2 = 0;
            ircode_add_skip(piVar6,0);
          }
          else {
            ircode_add_skip(piVar6,(node->token).lineno);
            uVar2 = (node->token).lineno;
          }
          ircode_add_skip(piVar6,uVar2);
          value.field_1.p = (gravity_object_t *)f_00.n;
          value.isa = (f_00.p)->isa;
          gravity_class_bind(c,"init",value);
        }
      }
      if (piVar5 == (ircode_t *)0x0) {
        return;
      }
    }
    if ((gravity_function_t *)f_00.n != (gravity_function_t *)0x0) {
      piVar5 = *(ircode_t **)(f_00.n + 0xa0);
      if (piVar5 == (ircode_t *)0x0) {
        report_error(self,node,"Invalid code context.");
      }
      else {
        if (node == (gnode_t *)0x0) {
          uVar2 = 0;
        }
        else {
          uVar2 = (node->token).lineno;
        }
        ircode_add(piVar5,RET,0,0,0,uVar2);
        if (f != (gravity_function_t *)0x0) {
          vm = *(gravity_vm **)((long)self->data + 0x38);
          gVar9 = gravity_string_to_value((gravity_vm *)0x0,"$init",0xffffffff);
          uVar1 = gravity_function_cpool_add(vm,(gravity_function_t *)f_00.p,gVar9);
          uVar2 = ircode_register_push_temp(piVar5);
          ircode_set_index(0,piVar5,LOADK,uVar2,(uint)uVar1,0);
          ircode_set_index(1,piVar5,LOAD,uVar2,0,uVar2);
          uVar3 = ircode_register_push_temp(piVar5);
          ircode_set_index(2,piVar5,MOVE,uVar3,0,0);
          piVar6 = piVar5;
          uVar3 = ircode_register_pop(piVar5);
          iVar8 = (int)piVar6;
          if (uVar3 == 0xffffffff) {
            process_constructor_cold_1();
            if ((iVar8 - 0x29U < 0x28) &&
               ((0x8007ff3ff9U >> ((ulong)(iVar8 - 0x29U) & 0x3f) & 1) != 0)) {
              return;
            }
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                          ,0x88,"opcode_t token2opcode(gtoken_t)");
          }
          ircode_set_index(3,piVar5,CALL,uVar2,uVar2,1);
        }
      }
      if (piVar5 == (ircode_t *)0x0) {
        return;
      }
    }
    if (f != (gravity_function_t *)0x0) {
      gravity_optimizer(f,false);
    }
    if ((gravity_function_t *)f_00.n != (gravity_function_t *)0x0) {
      gravity_optimizer((gravity_function_t *)f_00.p,false);
    }
  }
  pgVar7 = c->objclass;
  if (((pgVar7 != (gravity_class_t *)0x0) && (pgVar7->isa != (gravity_class_t *)0x0)) &&
     (pgVar7->isa != pgVar7->objclass)) {
    process_constructor(self,pgVar7,node);
  }
  return;
}

Assistant:

static void process_constructor (gvisitor_t *self, gravity_class_t *c, gnode_t *node) {
    DEBUG_CODEGEN("process_constructor");

    // $init is an internal function used to initialize instance variables to a default value
    // in case of subclasses USER is RESPONSIBLE to call super.init();
    // in case of subclasses COMPILER is RESPONSIBLE to create the appropriate $init call chain

    // check internal $init function
    gravity_function_t *internal_init_function = class_lookup_nosuper(c, CLASS_INTERNAL_INIT_NAME);

    // check for user constructor function
    gravity_function_t *constructor_function = class_lookup_nosuper(c, CLASS_CONSTRUCTOR_NAME);

    // build appropriate $init function
    gravity_class_t *super = c->superclass;
    uint32_t ninit = 2;
    while (super) {
        gravity_function_t *super_init = class_lookup_nosuper(super, CLASS_INTERNAL_INIT_NAME);
        if (super_init) {
            // copy super init code to internal_init code
            if (!internal_init_function) internal_init_function = gravity_function_new(NULL, CLASS_INTERNAL_INIT_NAME, 1, 0, 0, ircode_create(1));

            // build unique internal init name ($init2, $init3 and so on)
            char name[256];
            snprintf(name, sizeof(name), "%s%d", CLASS_INTERNAL_INIT_NAME, ninit++);

            // add new internal init to class and call it from main $init function
            // super_init should not be duplicated here because class hash table values are not freed (only keys are freed)
            gravity_class_bind(c, name, VALUE_FROM_OBJECT(super_init));
            uint16_t index = gravity_function_cpool_add(NULL, internal_init_function, VALUE_FROM_CSTRING(GET_VM(), name));
            ircode_patch_init((ircode_t *)internal_init_function->bytecode, index);
        }
        super = super->superclass;
    }

    // 4 cases to handle:

    // 1. internal_init and constuctor are not present, so nothing to do here
    if ((!internal_init_function) && (!constructor_function)) goto check_meta;

//    // 2. internal init is present and constructor is not used
//    if ((internal_init_function) && (!constructor_function)) {
//        // add a RET0 command
//        ircode_t *code = (ircode_t *)internal_init_function->bytecode;
//        ircode_add(code, RET0, 0, 0, 0);
//
//        // bind internal init as constructor
//        gravity_class_bind(c, CLASS_CONSTRUCTOR_NAME, VALUE_FROM_OBJECT(internal_init_function));
//        gravity_object_setenclosing((gravity_object_t *)internal_init_function, (gravity_object_t *)c);
//        goto process_funcs;
//    }

    // 3. internal init is present so constructor is mandatory
    if (internal_init_function) {
        // convert ircode to bytecode for $init special function and add a RET0 command
        ircode_t *code = (ircode_t *)internal_init_function->bytecode;
        if (!code) {report_error(self, node, "Invalid code context."); return;}
		ircode_add(code, RET0, 0, 0, 0, LINE_NUMBER(node));

        if (constructor_function == NULL) {
            constructor_function = gravity_function_new(NULL, CLASS_CONSTRUCTOR_NAME, 1, 0, 2, ircode_create(1));
            ircode_t *code2 = (ircode_t *)constructor_function->bytecode;
			ircode_add_skip(code2, LINE_NUMBER(node));	// LOADK
			ircode_add_skip(code2, LINE_NUMBER(node));	// LOAD
			ircode_add_skip(code2, LINE_NUMBER(node));	// MOVE
			ircode_add_skip(code2, LINE_NUMBER(node));	// CALL
            gravity_class_bind(c, CLASS_CONSTRUCTOR_NAME, VALUE_FROM_OBJECT(constructor_function));
        }
    }

    // 4. constructor is present so internal init is optional
    if (constructor_function) {
        // add an implicit RET 0 (RET self) to the end of the constructor
        ircode_t *code = (ircode_t *)constructor_function->bytecode;
        if (!code) {report_error(self, node, "Invalid code context."); return;}
		ircode_add(code, RET, 0, 0, 0, LINE_NUMBER(node));

        if (internal_init_function) {
            // if an internal init function is present ($init) then add a call to it as a first instruction
            uint16_t index = gravity_function_cpool_add(GET_VM(), constructor_function, VALUE_FROM_CSTRING(NULL, CLASS_INTERNAL_INIT_NAME));

            // load constant
            uint32_t dest = ircode_register_push_temp(code);
            ircode_set_index(0, code, LOADK, dest, index, 0);

            // load from lookup
            ircode_set_index(1, code, LOAD, dest, 0, dest);

            // prepare parameters
            uint32_t dest2 = ircode_register_push_temp(code);
            ircode_set_index(2, code, MOVE, dest2, 0, 0);
            uint32_t temp = ircode_register_pop(code);
            DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

            // execute call
            ircode_set_index(3, code, CALL, dest, dest, 1);
        }
    }

	if (internal_init_function) gravity_optimizer(internal_init_function, false);
	if (constructor_function) gravity_optimizer(constructor_function, false);

check_meta:
    // recursively process constructor but stop when object or class class is found, otherwise an infinite loop is triggered
    if ((c->objclass) && (c->objclass->isa) && (c->objclass->isa != c->objclass->objclass)) process_constructor(self, c->objclass, node);
}